

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

uint8 * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalSerialize
          (ModelProto_SentencePiece *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  float fVar2;
  int32 value;
  void *pvVar3;
  uint8 *puVar4;
  ulong uVar5;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    fVar2 = this->score_;
    *puVar4 = '\x15';
    *(float *)(puVar4 + 1) = fVar2;
    target = puVar4 + 5;
  }
  if ((uVar1 & 4) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = this->type_;
    *puVar4 = '\x18';
    target = google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                       (value,puVar4 + 1);
  }
  puVar4 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return puVar4;
  }
  uVar5 = (ulong)pvVar3 & 0xfffffffffffffffe;
  puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar5 + 8),*(int *)(uVar5 + 0x10),puVar4);
  return puVar4;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto_SentencePiece::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto.SentencePiece)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string piece = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_piece(), target);
  }

  // optional float score = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_score(), target);
  }

  // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_type(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto.SentencePiece)
  return target;
}